

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O2

FunctionData * __thiscall
ExpressionContext::GetCurrentFunction(ExpressionContext *this,ScopeData *scopeData)

{
  for (; (scopeData != (ScopeData *)0x0 && (scopeData->ownerType == (TypeBase *)0x0));
      scopeData = scopeData->scope) {
    if (scopeData->ownerFunction != (FunctionData *)0x0) {
      return scopeData->ownerFunction;
    }
  }
  return (FunctionData *)0x0;
}

Assistant:

FunctionData* ExpressionContext::GetCurrentFunction(ScopeData *scopeData)
{
	// Walk up, but if we reach a type owner, stop - we're not in a context of a function
	for(ScopeData *curr = scopeData; curr; curr = curr->scope)
	{
		if(curr->ownerType)
			return NULL;

		if(FunctionData *function = curr->ownerFunction)
			return function;
	}

	return NULL;
}